

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnTotalSize(Fts5Context *pCtx,int iCol,sqlite3_int64 *pnToken)

{
  int iVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  i64 *in_RDI;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = sqlite3Fts5StorageSize
                    ((Fts5Storage *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),in_RDI);
  return iVar1;
}

Assistant:

static int fts5ApiColumnTotalSize(
  Fts5Context *pCtx,
  int iCol,
  sqlite3_int64 *pnToken
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageSize(pTab->pStorage, iCol, pnToken);
}